

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<Person,_std::shared_ptr<Person>_> * __thiscall
pybind11::class_<Person,std::shared_ptr<Person>>::
def_property_static<pybind11::is_method,pybind11::return_value_policy>
          (class_<Person,std::shared_ptr<Person>> *this,char *name,cpp_function *fget,
          cpp_function *fset,is_method *extra,return_value_policy *extra_1)

{
  function_record *rec_fget_00;
  function_record *pfVar1;
  char *pcVar2;
  char *doc_prev;
  function_record *rec_fset;
  function_record *rec_fget;
  return_value_policy *extra_local_1;
  is_method *extra_local;
  cpp_function *fset_local;
  cpp_function *fget_local;
  char *name_local;
  class_<Person,_std::shared_ptr<Person>_> *this_local;
  
  rec_fget_00 = class_<Person,_std::shared_ptr<Person>_>::get_function_record
                          ((fget->super_function).super_object.super_handle.m_ptr);
  pfVar1 = class_<Person,_std::shared_ptr<Person>_>::get_function_record
                     ((fset->super_function).super_object.super_handle.m_ptr);
  pcVar2 = rec_fget_00->doc;
  detail::process_attributes<pybind11::is_method,_pybind11::return_value_policy>::init
            ((EVP_PKEY_CTX *)extra);
  if ((rec_fget_00->doc != (char *)0x0) && (rec_fget_00->doc != pcVar2)) {
    free(pcVar2);
    pcVar2 = strdup(rec_fget_00->doc);
    rec_fget_00->doc = pcVar2;
  }
  if (pfVar1 != (function_record *)0x0) {
    pcVar2 = pfVar1->doc;
    detail::process_attributes<pybind11::is_method,_pybind11::return_value_policy>::init
              ((EVP_PKEY_CTX *)extra);
    if ((pfVar1->doc != (char *)0x0) && (pfVar1->doc != pcVar2)) {
      free(pcVar2);
      pcVar2 = strdup(pfVar1->doc);
      pfVar1->doc = pcVar2;
    }
  }
  detail::generic_type::def_property_static_impl
            ((generic_type *)this,name,(fget->super_function).super_object.super_handle.m_ptr,
             (fset->super_function).super_object.super_handle.m_ptr,rec_fget_00);
  return (class_<Person,_std::shared_ptr<Person>_> *)this;
}

Assistant:

class_ &def_property_static(const char *name, const cpp_function &fget, const cpp_function &fset, const Extra& ...extra) {
        auto rec_fget = get_function_record(fget), rec_fset = get_function_record(fset);
        char *doc_prev = rec_fget->doc; /* 'extra' field may include a property-specific documentation string */
        detail::process_attributes<Extra...>::init(extra..., rec_fget);
        if (rec_fget->doc && rec_fget->doc != doc_prev) {
            free(doc_prev);
            rec_fget->doc = strdup(rec_fget->doc);
        }
        if (rec_fset) {
            doc_prev = rec_fset->doc;
            detail::process_attributes<Extra...>::init(extra..., rec_fset);
            if (rec_fset->doc && rec_fset->doc != doc_prev) {
                free(doc_prev);
                rec_fset->doc = strdup(rec_fset->doc);
            }
        }
        def_property_static_impl(name, fget, fset, rec_fget);
        return *this;
    }